

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O0

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Realloc
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,uint64_t matrix_width,
          uint64_t matrix_height,uint8_t num_codes)

{
  __mxxxi *palVar1;
  pointer pIVar2;
  size_type sVar3;
  Storage *pSVar4;
  long lVar5;
  value_type_conflict3 local_34 [4];
  byte local_21;
  uint64_t uStack_20;
  uint8_t num_codes_local;
  uint64_t matrix_height_local;
  uint64_t matrix_width_local;
  SimdAlignmentEngine<(spoa::Architecture)3> *this_local;
  
  local_21 = num_codes;
  uStack_20 = matrix_height;
  matrix_height_local = matrix_width;
  matrix_width_local = (uint64_t)this;
  pIVar2 = std::
           unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ::operator->(&this->pimpl_);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pIVar2->node_id_to_rank);
  if (sVar3 < uStack_20 - 1) {
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    local_34[3] = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&pIVar2->node_id_to_rank,uStack_20 - 1,(value_type_conflict1 *)(local_34 + 3));
  }
  pIVar2 = std::
           unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ::operator->(&this->pimpl_);
  sVar3 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::size
                    (&pIVar2->sequence_profile_storage);
  if (sVar3 < local_21 * matrix_height_local) {
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize
              (&pIVar2->sequence_profile_storage,local_21 * matrix_height_local);
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    pSVar4 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::data
                       (&pIVar2->sequence_profile_storage);
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    pIVar2->sequence_profile = pSVar4->val;
  }
  if ((this->super_AlignmentEngine).subtype_ == kLinear) {
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&pIVar2->first_column);
    if (sVar3 < uStack_20) {
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      local_34[2] = 0;
      std::vector<int,_std::allocator<int>_>::resize(&pIVar2->first_column,uStack_20,local_34 + 2);
    }
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::size(&pIVar2->M_storage);
    if (sVar3 < uStack_20 * matrix_height_local) {
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize
                (&pIVar2->M_storage,uStack_20 * matrix_height_local);
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pSVar4 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::data(&pIVar2->M_storage);
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->H = pSVar4->val;
    }
  }
  else if ((this->super_AlignmentEngine).subtype_ == kAffine) {
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&pIVar2->first_column);
    if (sVar3 < uStack_20 << 1) {
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      local_34[1] = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (&pIVar2->first_column,uStack_20 << 1,local_34 + 1);
    }
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::size(&pIVar2->M_storage);
    if (sVar3 < uStack_20 * 3 * matrix_height_local) {
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize
                (&pIVar2->M_storage,uStack_20 * 3 * matrix_height_local);
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pSVar4 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::data(&pIVar2->M_storage);
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->H = pSVar4->val;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      palVar1 = pIVar2->H;
      lVar5 = uStack_20 * matrix_height_local;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->F = palVar1 + lVar5;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      palVar1 = pIVar2->F;
      lVar5 = uStack_20 * matrix_height_local;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->E = palVar1 + lVar5;
    }
  }
  else if ((this->super_AlignmentEngine).subtype_ == kConvex) {
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&pIVar2->first_column);
    if (sVar3 < uStack_20 * 3) {
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      local_34[0] = 0;
      std::vector<int,_std::allocator<int>_>::resize(&pIVar2->first_column,uStack_20 * 3,local_34);
    }
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    sVar3 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::size(&pIVar2->M_storage);
    if (sVar3 < uStack_20 * 5 * matrix_height_local) {
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize
                (&pIVar2->M_storage,uStack_20 * 5 * matrix_height_local);
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pSVar4 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::data(&pIVar2->M_storage);
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->H = pSVar4->val;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      palVar1 = pIVar2->H;
      lVar5 = uStack_20 * matrix_height_local;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->F = palVar1 + lVar5;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      palVar1 = pIVar2->F;
      lVar5 = uStack_20 * matrix_height_local;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->E = palVar1 + lVar5;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      palVar1 = pIVar2->E;
      lVar5 = uStack_20 * matrix_height_local;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->O = palVar1 + lVar5;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      palVar1 = pIVar2->O;
      lVar5 = uStack_20 * matrix_height_local;
      pIVar2 = std::
               unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ::operator->(&this->pimpl_);
      pIVar2->Q = palVar1 + lVar5;
    }
  }
  pIVar2 = std::
           unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ::operator->(&this->pimpl_);
  sVar3 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::size(&pIVar2->masks_storage);
  if (sVar3 < 5) {
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize(&pIVar2->masks_storage,5);
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    pSVar4 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::data
                       (&pIVar2->masks_storage);
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    pIVar2->masks = pSVar4->val;
  }
  pIVar2 = std::
           unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
           ::operator->(&this->pimpl_);
  sVar3 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::size
                    (&pIVar2->penalties_storage);
  if (sVar3 < 8) {
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::resize(&pIVar2->penalties_storage,8)
    ;
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    pSVar4 = std::vector<spoa::Storage,_std::allocator<spoa::Storage>_>::data
                       (&pIVar2->penalties_storage);
    pIVar2 = std::
             unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
             ::operator->(&this->pimpl_);
    pIVar2->penalties = pSVar4->val;
  }
  return;
}

Assistant:

void SimdAlignmentEngine<A>::Realloc(
    std::uint64_t matrix_width,
    std::uint64_t matrix_height,
    std::uint8_t num_codes) {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  if (pimpl_->node_id_to_rank.size() < matrix_height - 1) {
    pimpl_->node_id_to_rank.resize(matrix_height - 1, 0);
  }
  if (pimpl_->sequence_profile_storage.size() < num_codes * matrix_width) {
    pimpl_->sequence_profile_storage.resize(num_codes * matrix_width);
    pimpl_->sequence_profile = reinterpret_cast<__mxxxi*>(pimpl_->sequence_profile_storage.data());
  }
  if (subtype_ == AlignmentSubtype::kLinear) {
    if (pimpl_->first_column.size() < matrix_height) {
      pimpl_->first_column.resize(matrix_height, 0);
    }
    if (pimpl_->M_storage.size() < matrix_height * matrix_width) {
      pimpl_->M_storage.resize(matrix_height * matrix_width);
      pimpl_->H = reinterpret_cast<__mxxxi*>(pimpl_->M_storage.data());
    }
  } else if (subtype_ == AlignmentSubtype::kAffine) {
    if (pimpl_->first_column.size() < 2 * matrix_height) {
      pimpl_->first_column.resize(2 * matrix_height, 0);
    }
    if (pimpl_->M_storage.size() < 3 * matrix_height * matrix_width) {
      pimpl_->M_storage.resize(3 * matrix_height * matrix_width);
      pimpl_->H = reinterpret_cast<__mxxxi*>(pimpl_->M_storage.data());
      pimpl_->F = pimpl_->H + matrix_height * matrix_width;
      pimpl_->E = pimpl_->F + matrix_height * matrix_width;
    }
  } else if (subtype_ == AlignmentSubtype::kConvex) {
    if (pimpl_->first_column.size() < 3 * matrix_height) {
      pimpl_->first_column.resize(3 * matrix_height, 0);
    }
    if (pimpl_->M_storage.size() < 5 * matrix_height * matrix_width) {
      pimpl_->M_storage.resize(5 * matrix_height * matrix_width);
      pimpl_->H = reinterpret_cast<__mxxxi*>(pimpl_->M_storage.data());
      pimpl_->F = pimpl_->H + matrix_height * matrix_width;
      pimpl_->E = pimpl_->F + matrix_height * matrix_width;
      pimpl_->O = pimpl_->E + matrix_height * matrix_width;
      pimpl_->Q = pimpl_->O + matrix_height * matrix_width;
    }
  }
  if (pimpl_->masks_storage.size() < InstructionSet<A, std::int16_t>::kLogNumVar + 1) {
    pimpl_->masks_storage.resize(InstructionSet<A, std::int16_t>::kLogNumVar + 1);
    pimpl_->masks = reinterpret_cast<__mxxxi*>(pimpl_->masks_storage.data());
  }
  if (pimpl_->penalties_storage.size() < 2 * InstructionSet<A, std::int16_t>::kLogNumVar) {  // NOLINT
    pimpl_->penalties_storage.resize(2 * InstructionSet<A, std::int16_t>::kLogNumVar);
    pimpl_->penalties = reinterpret_cast<__mxxxi*>(pimpl_->penalties_storage.data());
  }
#endif
  (void) matrix_width;
  (void) matrix_height;
  (void) num_codes;
}